

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O3

ostream * vk::operator<<(ostream *str,DebugReportMessage *message)

{
  uint uVar1;
  ostream *poVar2;
  Bitfield<32UL> local_38;
  
  uVar1 = message->flags;
  if ((anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits == '\0') {
    operator<<();
  }
  local_38.m_begin = (BitDesc *)(anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits;
  local_38.m_end = (BitDesc *)&(anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits;
  local_38.m_value = (ulong)uVar1;
  poVar2 = tcu::Format::Bitfield<32UL>::toStream(&local_38,str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(message->message)._M_dataplus._M_p,(message->message)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (code ",7);
  local_38.m_value = (deUint64)(uint)message->messageCode;
  tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_38,poVar2);
  if ((message->layerPrefix)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(str," from ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (str,(message->layerPrefix)._M_dataplus._M_p,(message->layerPrefix)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," at ",4);
  local_38.m_value = (deUint64)anon_unknown_0::getShortObjectTypeName;
  local_38.m_begin = (BitDesc *)CONCAT44(local_38.m_begin._4_4_,message->objectType);
  poVar2 = tcu::Format::Enum<vk::VkDebugReportObjectTypeEXT,_4UL>::toStream
                     ((Enum<vk::VkDebugReportObjectTypeEXT,_4UL> *)&local_38,str);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DebugReportMessage& message)
{
	str << shortDebugFlagsStr(message.flags) << ": "
		<< message.message
		<< " (code " << tcu::toHex(message.messageCode);

	if (!message.layerPrefix.empty())
		str << " from " << message.layerPrefix;

	str << " at " << shortObjectTypeStr(message.objectType) << ":" << message.location << ")";

	return str;
}